

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServiceRequestPdu.cpp
# Opt level: O0

void __thiscall DIS::ServiceRequestPdu::unmarshal(ServiceRequestPdu *this,DataStream *dataStream)

{
  undefined1 local_40 [8];
  SupplyQuantity x;
  size_t idx;
  DataStream *dataStream_local;
  ServiceRequestPdu *this_local;
  
  LogisticsFamilyPdu::unmarshal(&this->super_LogisticsFamilyPdu,dataStream);
  EntityID::unmarshal(&this->_requestingEntityID,dataStream);
  EntityID::unmarshal(&this->_servicingEntityID,dataStream);
  DataStream::operator>>(dataStream,&this->_serviceTypeRequested);
  DataStream::operator>>(dataStream,&this->_numberOfSupplyTypes);
  DataStream::operator>>(dataStream,&this->_serviceRequestPadding);
  std::vector<DIS::SupplyQuantity,_std::allocator<DIS::SupplyQuantity>_>::clear(&this->_supplies);
  x._quantity = '\0';
  x._25_7_ = 0;
  for (; (ulong)x._24_8_ < (ulong)this->_numberOfSupplyTypes; x._24_8_ = x._24_8_ + 1) {
    SupplyQuantity::SupplyQuantity((SupplyQuantity *)local_40);
    SupplyQuantity::unmarshal((SupplyQuantity *)local_40,dataStream);
    std::vector<DIS::SupplyQuantity,_std::allocator<DIS::SupplyQuantity>_>::push_back
              (&this->_supplies,(value_type *)local_40);
    SupplyQuantity::~SupplyQuantity((SupplyQuantity *)local_40);
  }
  return;
}

Assistant:

void ServiceRequestPdu::unmarshal(DataStream& dataStream)
{
    LogisticsFamilyPdu::unmarshal(dataStream); // unmarshal information in superclass first
    _requestingEntityID.unmarshal(dataStream);
    _servicingEntityID.unmarshal(dataStream);
    dataStream >> _serviceTypeRequested;
    dataStream >> _numberOfSupplyTypes;
    dataStream >> _serviceRequestPadding;

     _supplies.clear();
     for(size_t idx = 0; idx < _numberOfSupplyTypes; idx++)
     {
        SupplyQuantity x;
        x.unmarshal(dataStream);
        _supplies.push_back(x);
     }
}